

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

Value * __thiscall
Json::ValueIteratorBase::key(Value *__return_storage_ptr__,ValueIteratorBase *this)

{
  char *pcVar1;
  ValueHolder VVar2;
  CZString czstring;
  CZString local_30;
  
  Value::CZString::CZString(&local_30,(CZString *)((this->current_)._M_node + 1));
  VVar2.int_._4_4_ = 0;
  VVar2.uint_._0_4_ = local_30.field_1.index_;
  if (local_30.cstr_ == (char *)0x0) {
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x8 & 0xfe00 | 2;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    __return_storage_ptr__->value_ = VVar2;
  }
  else if ((local_30.field_1.index_ & 3) == 0) {
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x8 & 0xfe00 | 4;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    (__return_storage_ptr__->value_).string_ = local_30.cstr_;
  }
  else {
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x8 & 0xfe00 | 0x104;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    pcVar1 = duplicateAndPrefixStringValue(local_30.cstr_,local_30.field_1.index_ >> 2);
    (__return_storage_ptr__->value_).string_ = pcVar1;
  }
  if ((local_30.cstr_ != (char *)0x0) && ((local_30.field_1.index_ & 3) == 1)) {
    free(local_30.cstr_);
  }
  return __return_storage_ptr__;
}

Assistant:

Value ValueIteratorBase::key() const {
  const Value::CZString czstring = (*current_).first;
  if (czstring.data()) {
    if (czstring.isStaticString())
      return Value(StaticString(czstring.data()));
    return Value(czstring.data(), czstring.data() + czstring.length());
  }
  return Value(czstring.index());
}